

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_rectangle_gradient(rf_rec rec,rf_color col1,rf_color col2,rf_color col3,rf_color col4)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  rf_render_batch *prVar5;
  long lVar6;
  rf_vertex_buffer *prVar7;
  rf_gfx_texcoord_data_type *prVar8;
  rf_context *prVar9;
  float local_78;
  float fStack_74;
  float local_58;
  float fStack_54;
  
  prVar9 = rf__ctx;
  if ((rf__ctx->field_0).tex_shapes.id == 0) {
    (rf__ctx->field_0).tex_shapes.id = (rf__ctx->field_0).default_texture_id;
    (prVar9->field_0).tex_shapes.width = 1;
    (prVar9->field_0).tex_shapes.height = 1;
    (prVar9->field_0).tex_shapes.mipmaps = 1;
    (prVar9->field_0).tex_shapes.format = RF_UNCOMPRESSED_R8G8B8A8;
    *(undefined4 *)&(prVar9->field_0).tex_shapes.valid = 0;
    (prVar9->field_0).rec_tex_shapes.x = 0.0;
    (prVar9->field_0).rec_tex_shapes.y = 0.0;
    (prVar9->field_0).rec_tex_shapes.width = 1.0;
    (prVar9->field_0).rec_tex_shapes.height = 1.0;
  }
  rf_gfx_enable_texture((prVar9->field_0).tex_shapes.id);
  rf_gfx_push_matrix();
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(col1.r,col1.g,col1.b,col1.a);
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = fVar1 / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  local_58 = rec.x;
  fStack_54 = rec.y;
  rf_gfx_vertex3f(local_58,fStack_54,prVar5->current_depth);
  rf_gfx_color4ub(col2.r,col2.g,col2.b,col2.a);
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  fVar2 = (rf__ctx->field_0).rec_tex_shapes.height;
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = (fVar1 + fVar2) / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  local_78 = rec.width;
  fStack_74 = rec.height;
  rf_gfx_vertex3f(local_58,fStack_74 + fStack_54,prVar5->current_depth);
  rf_gfx_color4ub(col3.r,col3.g,col3.b,col3.a);
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  fVar2 = (rf__ctx->field_0).rec_tex_shapes.height;
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
       (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = (fVar1 + fVar2) / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  rf_gfx_vertex3f(local_78 + local_58,fStack_74 + fStack_54,prVar5->current_depth);
  rf_gfx_color4ub(col4.r,col4.g,col4.b,col4.a);
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
       (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = fVar1 / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  rf_gfx_vertex3f(local_78 + local_58,fStack_54,prVar5->current_depth);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_rectangle_gradient(rf_rec rec, rf_color col1, rf_color col2, rf_color col3, rf_color col4)
{
    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_begin(RF_QUADS);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);

    // NOTE: Default raylib font character 95 is a white square
    rf_gfx_color4ub(col1.r, col1.g, col1.b, col1.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y);

    rf_gfx_color4ub(col2.r, col2.g, col2.b, col2.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y + rec.height);

    rf_gfx_color4ub(col3.r, col3.g, col3.b, col3.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y + rec.height);

    rf_gfx_color4ub(col4.r, col4.g, col4.b, col4.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}